

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetimepicker.cpp
# Opt level: O1

void __thiscall QtMWidgets::DateTimePicker::paintEvent(DateTimePicker *this,QPaintEvent *param_1)

{
  ColorGroup CVar1;
  long *plVar2;
  DateTimePickerPrivate *pDVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  QPainter p;
  QRect r;
  QStyleOption opt;
  QPainter aQStack_88 [8];
  QRect local_80;
  QStyleOption local_70 [64];
  
  pDVar3 = (this->d).d;
  if (0 < (pDVar3->super_DateTimeParser).sections.d.size) {
    lVar6 = 0;
    do {
      DateTimePickerPrivate::normalizeOffset(pDVar3,(int)lVar6);
      lVar6 = lVar6 + 1;
    } while (lVar6 < (pDVar3->super_DateTimeParser).sections.d.size);
  }
  QStyleOption::QStyleOption(local_70,1,0);
  QStyleOption::initFrom((QWidget *)local_70);
  QPainter::QPainter(aQStack_88,(QPaintDevice *)&this->field_0x10);
  pDVar3 = (this->d).d;
  if (0 < (pDVar3->super_DateTimeParser).sections.d.size) {
    lVar5 = 0;
    lVar6 = 8;
    iVar4 = 0;
    do {
      local_80.y1 = 0;
      local_80.x2 = *(int *)((long)&((pDVar3->super_DateTimeParser).sections.d.ptr)->type + lVar6) +
                    iVar4 + -1;
      local_80.y2 = pDVar3->widgetHeight + -1;
      local_80.x1 = iVar4;
      CVar1 = QWidget::palette();
      plVar2 = (long *)QPalette::brush(CVar1,Dark);
      drawCylinder(aQStack_88,&local_80,(QColor *)(*plVar2 + 8),lVar5 == 0,
                   lVar5 == (((this->d).d)->super_DateTimeParser).sections.d.size + -1);
      DateTimePickerPrivate::drawSectionItems((this->d).d,(int)lVar5,aQStack_88,local_70);
      iVar4 = iVar4 + *(int *)((long)&((((this->d).d)->super_DateTimeParser).sections.d.ptr)->type +
                              lVar6);
      lVar5 = lVar5 + 1;
      pDVar3 = (this->d).d;
      lVar6 = lVar6 + 0x30;
    } while (lVar5 < (pDVar3->super_DateTimeParser).sections.d.size);
  }
  DateTimePickerPrivate::drawWindow(pDVar3,aQStack_88,local_70);
  QPainter::~QPainter(aQStack_88);
  QStyleOption::~QStyleOption(local_70);
  return;
}

Assistant:

void
DateTimePicker::paintEvent( QPaintEvent * )
{
	d->normalizeOffsets();

	QStyleOption opt;
	opt.initFrom( this );

	QPainter p( this );

	int x = 0;

	for( int i = 0; i < d->sections.size(); ++i )
	{
		const QRect r( x, 0, d->sections.at( i ).sectionWidth, d->widgetHeight );

		drawCylinder( &p, r, palette().color( QPalette::Dark ),
			( i == 0 ), ( i == d->sections.size() - 1 ) );

		d->drawSectionItems( i, &p, opt );

		x += d->sections.at( i ).sectionWidth;
	}

	d->drawWindow( &p, opt );
}